

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<float>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,char *absc,float val1,
          float val2,float abs_v)

{
  bool bVar1;
  AssertionResult *pAVar2;
  FInt local_ac;
  string local_98;
  AssertionResult local_68;
  floating_point<float> local_40;
  floating_point<float> local_3c;
  floating_point<float> f2;
  floating_point<float> f1;
  float diff;
  float abs_v_local;
  float val2_local;
  float val1_local;
  char *absc_local;
  char *expr2_local;
  char *expr1_local;
  
  if (val1 <= val2) {
    local_ac.fv = val2 - val1;
  }
  else {
    local_ac.fv = val1 - val2;
  }
  f2.m_v = local_ac;
  f1.m_v = (FInt)abs_v;
  diff = val2;
  abs_v_local = val1;
  _val2_local = absc;
  absc_local = expr2;
  expr2_local = expr1;
  expr1_local = (char *)__return_storage_ptr__;
  if (local_ac.fv < abs_v) {
    AssertionSuccess();
  }
  else {
    floating_point<float>::floating_point(&local_3c,local_ac.fv);
    floating_point<float>::floating_point(&local_40,(float)f1.m_v);
    bVar1 = floating_point<float>::AlmostEquals(&local_3c,&local_40);
    if (bVar1) {
      AssertionSuccess();
    }
    else {
      AssertionFailure();
      pAVar2 = AssertionResult::operator<<(&local_68,(char (*) [22])"error: Value of: abs(");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&absc_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [6])") <= ");
      pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&val2_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"\n  Actual: abs(");
      pAVar2 = AssertionResult::operator<<(pAVar2,&abs_v_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&diff);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])") : ");
      pAVar2 = AssertionResult::operator<<(pAVar2,(float *)&f2);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
      FormatForComparisonFailureMessage<float,float>
                (&local_98,(internal *)&f1,(float *)&f2,(float *)absc);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_98);
      AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
      std::__cxx11::string::~string((string *)&local_98);
      AssertionResult::~AssertionResult(&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }